

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semiintersect_iterator.hpp
# Opt level: O2

outer_range_iterator __thiscall
burst::
semiintersect_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<std::_List_iterator<char>_>_*,_std::vector<boost::iterator_range<std::_List_iterator<char>_>,_std::allocator<boost::iterator_range<std::_List_iterator<char>_>_>_>_>,_std::greater<void>_>
::skip_while_less(semiintersect_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<std::_List_iterator<char>_>_*,_std::vector<boost::iterator_range<std::_List_iterator<char>_>,_std::allocator<boost::iterator_range<std::_List_iterator<char>_>_>_>_>,_std::greater<void>_>
                  *this,outer_range_iterator range,outer_range_iterator candidate)

{
  reference pcVar1;
  reference pcVar2;
  
  do {
    if (range._M_current == candidate._M_current) {
      return (outer_range_iterator)range._M_current;
    }
    pcVar1 = boost::iterator_range_detail::
             iterator_range_base<std::_List_iterator<char>,_boost::iterators::incrementable_traversal_tag>
             ::front((iterator_range_base<std::_List_iterator<char>,_boost::iterators::incrementable_traversal_tag>
                      *)range._M_current);
    pcVar2 = boost::iterator_range_detail::
             iterator_range_base<std::_List_iterator<char>,_boost::iterators::incrementable_traversal_tag>
             ::front((iterator_range_base<std::_List_iterator<char>,_boost::iterators::incrementable_traversal_tag>
                      *)candidate._M_current);
    if (*pcVar2 < *pcVar1) {
      pcVar1 = boost::iterator_range_detail::
               iterator_range_base<std::_List_iterator<char>,_boost::iterators::incrementable_traversal_tag>
               ::front((iterator_range_base<std::_List_iterator<char>,_boost::iterators::incrementable_traversal_tag>
                        *)candidate._M_current);
      skip_to_lower_bound<boost::iterator_range<std::_List_iterator<char>>,char,std::greater<void>>
                (range._M_current,pcVar1);
      if ((((iterator_range_base<std::_List_iterator<char>,_boost::iterators::incrementable_traversal_tag>
             *)range._M_current)->m_Begin)._M_node ==
          (((iterator_range_base<std::_List_iterator<char>,_boost::iterators::incrementable_traversal_tag>
             *)range._M_current)->m_End)._M_node) {
        return (outer_range_iterator)range._M_current;
      }
      pcVar1 = boost::iterator_range_detail::
               iterator_range_base<std::_List_iterator<char>,_boost::iterators::incrementable_traversal_tag>
               ::front((iterator_range_base<std::_List_iterator<char>,_boost::iterators::incrementable_traversal_tag>
                        *)candidate._M_current);
      pcVar2 = boost::iterator_range_detail::
               iterator_range_base<std::_List_iterator<char>,_boost::iterators::incrementable_traversal_tag>
               ::front((iterator_range_base<std::_List_iterator<char>,_boost::iterators::incrementable_traversal_tag>
                        *)range._M_current);
      if (*pcVar2 < *pcVar1) {
        return (outer_range_iterator)range._M_current;
      }
    }
    range._M_current =
         (iterator_range<std::_List_iterator<char>_> *)
         ((iterator_range_base<std::_List_iterator<char>,_boost::iterators::incrementable_traversal_tag>
           *)range._M_current + 1);
  } while( true );
}

Assistant:

outer_range_iterator skip_while_less (outer_range_iterator range, outer_range_iterator candidate)
        {
            while (range != candidate)
            {
                if (m_compare(range->front(), candidate->front()))
                {
                    skip_to_lower_bound(*range, candidate->front(), m_compare);
                    if (range->empty() || m_compare(candidate->front(), range->front()))
                    {
                        break;
                    }
                }

                ++range;
            }

            return range;
        }